

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<double> *original_costs,
            double cost_constant)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *this_00;
  context *ctx;
  bool bVar5;
  undefined8 uVar6;
  unique_ptr<double[],_std::default_delete<double[]>_> P;
  unique_ptr<double[],_std::default_delete<double[]>_> uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  rep rVar12;
  undefined8 extraout_RAX;
  long lVar13;
  result_status rVar14;
  random_engine *rng;
  int iVar15;
  long lVar16;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  double *in_R9;
  ulong uVar17;
  double dVar18;
  undefined1 auVar20 [16];
  double dVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM4_Qb;
  string_view filename;
  bit_array x;
  quadratic_cost_type<double> norm_costs;
  compute_order compute;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  slv;
  file_observer obs;
  double local_4e0;
  bit_array_impl local_4c8;
  uint local_4b4;
  pointer local_4b0;
  double local_4a8;
  quadratic_cost_type<double> *local_4a0;
  double local_498;
  ulong local_490;
  int local_484;
  double local_480;
  double local_478;
  double local_470;
  quadratic_cost_type<double> local_468;
  double local_448;
  double local_440;
  compute_order local_438;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  local_400;
  undefined1 local_288 [8];
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Stack_280;
  filebuf local_278 [240];
  ios_base local_188 [264];
  ap_file_observer local_80;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_498 = cost_constant;
  bit_array_impl::bit_array_impl(&local_4c8,variables);
  this_00 = this->m_ctx;
  normalize_costs<double,baryonyx::itm::quadratic_cost_type<double>>
            (&local_468,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<double> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             (int)in_R9);
  local_478 = (this_00->parameters).kappa_step;
  local_470 = (this_00->parameters).kappa_max;
  local_480 = (this_00->parameters).alpha;
  local_4a8 = (this_00->parameters).theta;
  local_4b0 = (pointer)(this_00->parameters).delta;
  if ((double)local_4b0 < 0.0) {
    ctx = this->m_ctx;
    local_288 = (undefined1  [8])local_4a8;
    info<>(ctx,"  - delta not defined, compute it:\n");
    auVar23._0_8_ = (FILE *)quadratic_cost_type<double>::min(&local_468,variables);
    auVar23._8_56_ = extraout_var;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_288;
    auVar1 = vfnmadd132sd_fma(auVar23._0_16_,auVar23._0_16_,auVar1);
    local_438.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar1._0_8_;
    local_400.super_debug_logger<false>.ofs = auVar23._0_8_;
    info<double,double,double>
              ((baryonyx *)ctx,(context *)"    - delta={} (min normalized cost:{} / theta: {})\n",
               (char *)&local_438,(double *)&local_400,(double *)local_288,in_R9);
    local_4b0 = local_438.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  local_440 = (this_00->parameters).pushing_k_factor;
  local_448 = (this_00->parameters).pushing_objective_amplifier;
  local_490 = (ulong)(this_00->parameters).w;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  ::solver_inequalities_Zcoeff
            (&local_400,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_468,constraints);
  compute_order::compute_order(&local_438,(this_00->parameters).order,variables);
  dVar19 = (this->m_ctx->parameters).init_policy_random;
  local_288 = (undefined1  [8])0x0;
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar4 = (this_00->parameters).init_policy;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)&local_4c8,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_4c8;
      x_optimistic = (bit_array_impl *)local_288;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_005865bf;
      rng = this->m_rng;
      x_pessimistic = (bit_array_impl *)local_288;
      x_optimistic = &local_4c8;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_005865bf:
  local_4a0 = original_costs;
  if (local_4c8.m_size != 0) {
    iVar15 = 0;
    do {
      dVar18 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar18 < dVar19) {
        bit_array_impl::invert(&local_4c8,iVar15);
      }
      iVar15 = iVar15 + 1;
    } while (local_4c8.m_size != iVar15);
  }
  if (_Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)_Stack_280._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  dVar19 = (this_00->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  file_observer::file_observer
            ((file_observer *)local_288,filename,local_400.m,local_400.n,(this_00->parameters).limit
            );
  rVar12 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar12;
  rVar12 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar12;
  compute_order::
  init<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array>
            (&local_438,&local_400,(bit_array *)&local_4c8);
  auVar23 = ZEXT864((ulong)dVar19);
  local_484 = variables;
  if ((this_00->parameters).limit == 0) {
    uVar9 = 0;
  }
  else {
    iVar15 = 0x7fffffff;
    lVar16 = 0;
    local_4b4 = 0;
    do {
      auVar20._0_8_ = auVar23._0_8_;
      iVar8 = compute_order::
              run<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                        (&local_438,&local_400,(bit_array *)&local_4c8,this->m_rng,auVar20._0_8_,
                         (double)local_4b0,local_4a8);
      uVar7._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_400.pi;
      P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_400.P;
      details::pi_file_observer::make_observation<double>
                ((pi_file_observer *)local_288,&local_400.ap,
                 (double *)
                 local_400.P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                 .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 local_400.pi._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      details::ap_file_observer::make_observation<double>
                (&local_80,&local_400.ap,
                 (double *)
                 P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 uVar7._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      if (iVar8 == 0) {
        dVar19 = quadratic_cost_type<double>::results(local_4a0,(bit_array *)&local_4c8,local_498);
        store_if_better(this,(bit_array *)&local_4c8,dVar19,lVar16);
        local_4b4 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        iVar15 = 0;
        bVar5 = false;
        local_4e0 = auVar20._0_8_;
LAB_0058679e:
        auVar23 = ZEXT864((ulong)local_4e0);
      }
      else {
        if (iVar8 < iVar15) {
          store_if_better(this,(bit_array *)&local_4c8,iVar8,lVar16);
          iVar15 = iVar8;
        }
        if ((long)local_490 < lVar16) {
          auVar24._0_8_ = pow((double)iVar8 / (double)local_400.m,local_480);
          auVar24._8_56_ = extraout_var_00;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = auVar20._0_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_478;
          auVar20 = vfmadd231sd_fma(auVar26,auVar24._0_16_,auVar2);
        }
        else {
          auVar20._8_8_ = 0;
        }
        auVar23 = ZEXT1664(auVar20);
        rVar14 = kappa_max_reached;
        local_4e0 = auVar20._0_8_;
        if (local_470 < local_4e0) {
LAB_005867fd:
          __return_storage_ptr__->status = rVar14;
          bVar5 = false;
        }
        else {
          lVar13 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar13;
          dVar19 = (this->m_ctx->parameters).time_limit;
          bVar5 = true;
          if (dVar19 <= 0.0) goto LAB_0058679e;
          rVar14 = time_limit_reached;
          auVar23 = ZEXT864((ulong)local_4e0);
          if (dVar19 < (double)(lVar13 - (this->m_begin).__d.__r) / 1000000000.0) goto LAB_005867fd;
        }
      }
      uVar9 = local_4b4;
    } while ((bVar5) && (lVar16 = lVar16 + 1, lVar16 != (this_00->parameters).limit));
  }
  if ((uVar9 & 1) == 0) {
    __return_storage_ptr__->status = limit_reached;
  }
  else if (0 < (this_00->parameters).pushes_limit) {
    iVar15 = 0;
    iVar8 = 0;
    do {
      local_4e0 = auVar23._0_8_;
      iVar10 = compute_order::
               push_and_run<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                         (&local_438,&local_400,(bit_array *)&local_4c8,this->m_rng,
                          local_4e0 * local_440,(double)local_4b0,local_4a8,local_448);
      if (iVar10 == 0) {
        dVar19 = quadratic_cost_type<double>::results(local_4a0,(bit_array *)&local_4c8,local_498);
        store_if_better(this,(bit_array *)&local_4c8,dVar19,
                        (long)~((this_00->parameters).pushing_iteration_limit * iVar8));
      }
      lVar16 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar16;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = (this->m_ctx->parameters).time_limit;
      auVar21._0_8_ = (double)(lVar16 - (this->m_begin).__d.__r) / 1000000000.0;
      auVar21._8_8_ = in_XMM4_Qb;
      uVar6 = vcmppd_avx512vl(auVar27,ZEXT816(0),6);
      uVar17 = vcmppd_avx512vl(auVar27,auVar21,1);
      uVar17 = ((byte)uVar6 & 3) & uVar17;
      local_490 = CONCAT62(local_490._2_6_,(short)uVar17);
      if ((uVar17 & 1) == 0) {
        auVar23 = ZEXT864((ulong)local_4e0);
        if (0 < (this_00->parameters).pushing_iteration_limit) {
          iVar10 = 1;
          do {
            auVar22._0_8_ = auVar23._0_8_;
            iVar11 = compute_order::
                     run<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                               (&local_438,&local_400,(bit_array *)&local_4c8,this->m_rng,
                                auVar22._0_8_,(double)local_4b0,local_4a8);
            if (iVar11 == 0) {
              dVar19 = quadratic_cost_type<double>::results
                                 (local_4a0,(bit_array *)&local_4c8,local_498);
              store_if_better(this,(bit_array *)&local_4c8,dVar19,
                              (long)((this_00->parameters).pushing_iteration_limit * iVar15 - iVar10
                                    ));
              auVar23 = ZEXT864((ulong)auVar22._0_8_);
              break;
            }
            if ((double)(iVar10 + -1) <= (this_00->parameters).w) {
              auVar22._8_8_ = 0;
            }
            else {
              auVar25._0_8_ = pow((double)iVar11 / (double)local_400.m,local_480);
              auVar25._8_56_ = extraout_var_01;
              auVar28._8_8_ = 0;
              auVar28._0_8_ = auVar22._0_8_;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_478;
              auVar22 = vfmadd231sd_fma(auVar28,auVar25._0_16_,auVar3);
            }
            auVar23 = ZEXT1664(auVar22);
            local_4e0 = auVar22._0_8_;
            if (local_470 < local_4e0) break;
            lVar16 = std::chrono::_V2::steady_clock::now();
            (this->m_end).__d.__r = lVar16;
            dVar19 = (this->m_ctx->parameters).time_limit;
            if ((0.0 < dVar19) &&
               (dVar19 < (double)(lVar16 - (this->m_begin).__d.__r) / 1000000000.0))
            goto LAB_00586909;
            auVar23 = ZEXT864((ulong)local_4e0);
            bVar5 = iVar10 < (this_00->parameters).pushing_iteration_limit;
            iVar10 = iVar10 + 1;
          } while (bVar5);
        }
      }
      else {
LAB_00586909:
        auVar23 = ZEXT864((ulong)local_4e0);
      }
      if ((local_490 & 1) != 0) break;
      iVar8 = iVar8 + 1;
      iVar15 = iVar15 + -1;
    } while (iVar8 < (this_00->parameters).pushes_limit);
  }
  iVar15 = local_484;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar15);
  }
  if (local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_basename._M_dataplus._M_p != &local_80.m_basename.field_2) {
    operator_delete(local_80.m_basename._M_dataplus._M_p,
                    local_80.m_basename.field_2._M_allocated_capacity + 1);
  }
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_VTT;
  *(undefined8 *)(local_278 + _VTT[-3] + -8) = _log;
  std::filebuf::~filebuf(local_278);
  std::ios_base::~ios_base(local_188);
  if (local_438.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_438.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_438.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  ::~solver_inequalities_Zcoeff(&local_400);
  if ((__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
      local_468.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
    operator_delete__((void *)local_468.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_468.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((tuple<baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
       )local_468.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>)0x0) {
    operator_delete__((void *)local_468.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                              ._M_head_impl);
  }
  local_468.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          )0x0;
  if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)
      local_468.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (double *)0x0) {
    operator_delete__((void *)local_468.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_unsigned_long_*,_false>)
      local_4c8.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_4c8.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }